

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

Namespace * __thiscall
Vault::Client::getNamespace_abi_cxx11_(Namespace *__return_storage_ptr__,Client *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->namespace_);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual Namespace getNamespace() const { return namespace_; }